

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

ssize_t __thiscall MemOStream::write(MemOStream *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  void *pvVar2;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  size_t __n_00;
  
  __n_00 = (size_t)(int)__buf;
  pcVar1 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->streamptr + __n_00 <=
      (ulong)((long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar1)) {
    pvVar2 = memcpy(pcVar1 + this->streamptr,(void *)CONCAT44(in_register_00000034,__fd),__n_00);
    this->streamptr = this->streamptr + __n_00;
    return (ssize_t)pvVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"attempt to write beyond preallocated memory");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write (const char c[], int n) override
    {
        if (n + streamptr > data.size ())
        {
            throw runtime_error ("attempt to write beyond preallocated memory");
        }
        memcpy (data.data () + streamptr, c, n);
        streamptr += n;
    }